

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O3

Vec_Vec_t * Nwk_ManLevelize(Nwk_Man_t *pNtk)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  Vec_Vec_t *pVVar5;
  void **ppvVar6;
  void *pvVar7;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint local_48;
  
  iVar3 = Nwk_ManVerifyLevel(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Nwk_ManVerifyLevel(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                  ,0x112,"Vec_Vec_t *Nwk_ManLevelize(Nwk_Man_t *)");
  }
  uVar4 = Nwk_ManLevelMax(pNtk);
  uVar12 = uVar4 + 1;
  pVVar5 = (Vec_Vec_t *)malloc(0x10);
  local_48 = 8;
  if (6 < uVar4) {
    local_48 = uVar12;
  }
  pVVar5->nCap = local_48;
  if (local_48 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)(int)local_48 << 3);
  }
  pVVar5->pArray = ppvVar6;
  if (-1 < (int)uVar4) {
    uVar14 = 0;
    do {
      pvVar7 = calloc(1,0x10);
      ppvVar6[uVar14] = pvVar7;
      uVar14 = uVar14 + 1;
    } while (uVar12 != uVar14);
  }
  pVVar5->nSize = uVar12;
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      pvVar7 = pVVar9->pArray[lVar13];
      if ((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x20) & 7) == 3)) {
        uVar1 = *(uint *)((long)pvVar7 + 0x2c);
        if ((int)uVar4 < (int)uVar1) {
          __assert_fail("Nwk_ObjLevel(pObj) <= nLevels",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                        ,0x117,"Vec_Vec_t *Nwk_ManLevelize(Nwk_Man_t *)");
        }
        if ((int)uVar12 <= (int)uVar1) {
          uVar10 = uVar1 + 1;
          ppvVar6 = pVVar5->pArray;
          if ((int)local_48 <= (int)uVar1) {
            if (ppvVar6 == (void **)0x0) {
              ppvVar6 = (void **)malloc((long)(int)uVar10 << 3);
            }
            else {
              ppvVar6 = (void **)realloc(ppvVar6,(long)(int)uVar10 << 3);
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nCap = uVar10;
            local_48 = uVar10;
          }
          lVar11 = 0;
          do {
            pvVar8 = calloc(1,0x10);
            ppvVar6[(int)uVar12 + lVar11] = pvVar8;
            lVar11 = lVar11 + 1;
          } while ((uVar1 - uVar12) + 1 != (int)lVar11);
          pVVar5->nSize = uVar10;
          uVar12 = uVar10;
        }
        if (((int)uVar1 < 0) || ((int)uVar12 <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        puVar2 = (uint *)pVVar5->pArray[uVar1];
        uVar1 = puVar2[1];
        if (uVar1 == *puVar2) {
          if ((int)uVar1 < 0x10) {
            if (*(void **)(puVar2 + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(puVar2 + 2),0x80);
            }
            *(void **)(puVar2 + 2) = pvVar8;
            *puVar2 = 0x10;
          }
          else {
            if (*(void **)(puVar2 + 2) == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar1 << 4);
            }
            else {
              pvVar8 = realloc(*(void **)(puVar2 + 2),(ulong)uVar1 << 4);
            }
            *(void **)(puVar2 + 2) = pvVar8;
            *puVar2 = uVar1 * 2;
          }
        }
        else {
          pvVar8 = *(void **)(puVar2 + 2);
        }
        uVar1 = puVar2[1];
        puVar2[1] = uVar1 + 1;
        *(void **)((long)pvVar8 + (long)(int)uVar1 * 8) = pvVar7;
        pVVar9 = pNtk->vObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar9->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Vec_t * Nwk_ManLevelize( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    assert( Nwk_ManVerifyLevel(pNtk) );
    nLevels = Nwk_ManLevelMax( pNtk );
    vLevels = Vec_VecStart( nLevels + 1 );
    Nwk_ManForEachNode( pNtk, pObj, i )
    {
        assert( Nwk_ObjLevel(pObj) <= nLevels );
        Vec_VecPush( vLevels, Nwk_ObjLevel(pObj), pObj );
    }
    return vLevels;
}